

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_vexp.c
# Opt level: O2

ex_ex * ex_eval(expr *expr,ex_ex *eptr,ex_ex *optr,int idx)

{
  byte bVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined4 uVar8;
  uint uVar9;
  ex_ex *peVar10;
  anon_union_8_5_735de1bb_for_ex_cont aVar11;
  t_float *ptVar12;
  ulong uVar13;
  undefined1 uVar14;
  undefined4 uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  char *pcVar19;
  ulong uVar20;
  undefined8 uVar21;
  bool bVar22;
  t_float tVar23;
  float fVar24;
  anon_union_8_5_735de1bb_for_ex_cont aVar25;
  anon_union_8_5_735de1bb_for_ex_cont local_78;
  long lStack_70;
  undefined8 local_68;
  anon_union_8_5_735de1bb_for_ex_cont local_58;
  long lStack_50;
  undefined8 local_48;
  t_float local_34;
  
  local_48 = 0;
  local_68 = 0;
  local_58.v_int = 0;
  lStack_50 = 0;
  local_78.v_int = 0;
  lStack_70 = 0;
  if (eptr == (ex_ex *)0x0) {
    return (ex_ex *)0x0;
  }
  uVar13 = eptr->ex_type;
  switch(uVar13) {
  case 1:
    if (optr->ex_type == 0xf) {
      lVar16 = (eptr->ex_cont).v_int;
      ptVar12 = (optr->ex_cont).v_vec;
      iVar18 = expr->exp_vsize;
      for (lVar17 = 0; iVar18 != (int)lVar17; lVar17 = lVar17 + 1) {
        ptVar12[lVar17] = (float)lVar16;
      }
      goto LAB_001899ff;
    }
    break;
  case 2:
    if (optr->ex_type == 0xf) {
      ptVar12 = (optr->ex_cont).v_vec;
      tVar23 = (eptr->ex_cont).v_flt;
      iVar18 = expr->exp_vsize;
      for (lVar16 = 0; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
        ptVar12[lVar16] = tVar23;
      }
      goto LAB_001899ff;
    }
    break;
  case 3:
    if (eptr[1].ex_type == 0) {
      pcVar19 = "expr: ex_eval: not enough nodes 1\n";
      goto LAB_00189a0c;
    }
    lVar16 = (eptr->ex_cont).v_int;
    if ((2 < lVar16 - 0xe0015U) && (eptr[2].ex_type == 0)) {
      pcVar19 = "expr: ex_eval: not enough nodes 2\n";
      goto LAB_00189a0c;
    }
    peVar10 = eptr + 1;
    switch(lVar16) {
    case 0xa000a:
      peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
      peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
      if (lStack_50 - 0xeU < 2) {
        if (optr->ex_type == 0xf) {
          ptVar12 = (optr->ex_cont).v_vec;
        }
        else {
          if (optr->ex_type == 0xe) {
LAB_0018ed72:
            uVar21 = 0x4cd;
LAB_0018edee:
            post("expr~: Int. error %d",uVar21);
            abort();
          }
          optr->ex_type = 0xf;
          ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
          (optr->ex_cont).v_vec = ptVar12;
        }
        if (lStack_70 - 0xeU < 2) {
          lVar16 = 0;
          iVar18 = expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            iVar18 = 0;
          }
          for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] =
                 (t_float)(-(uint)(local_78.v_vec[lVar16] <= local_58.v_vec[lVar16]) & 0x3f800000);
          }
          goto LAB_0018be23;
        }
        if (lStack_70 == 2) {
          lVar16 = 0;
          iVar18 = expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            iVar18 = 0;
          }
          for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] =
                 (t_float)(-(uint)(local_78.v_flt <= local_58.v_vec[lVar16]) & 0x3f800000);
          }
          goto LAB_0018be23;
        }
        if (lStack_70 == 1) {
          lVar16 = 0;
          iVar18 = expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            iVar18 = 0;
          }
          for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] =
                 (t_float)(-(uint)((float)local_78.v_int <= local_58.v_vec[lVar16]) & 0x3f800000);
          }
          goto LAB_0018be23;
        }
LAB_0018bd6d:
        pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
        peVar10 = (ex_ex *)0x0;
      }
      else {
        if (lStack_50 == 2) {
          if (lStack_70 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) goto LAB_0018ed72;
              optr->ex_type = 0xf;
              ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar12;
            }
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] =
                   (t_float)(-(uint)(local_78.v_vec[lVar16] <= local_58.v_flt) & 0x3f800000);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = (t_float)(-(uint)(local_78.v_flt <= local_58.v_flt) & 0x3f800000);
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            uVar15 = local_78.v_flt;
          }
          else {
            if (lStack_70 != 1) goto LAB_0018bd6d;
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] =
                     (t_float)(-(uint)((float)local_78.v_int <= local_58.v_flt) & 0x3f800000);
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            uVar15 = (float)local_78.v_int;
          }
          uVar9 = -(uint)((float)uVar15 <= local_58.v_flt);
LAB_0018e5cc:
          tVar23 = (t_float)(uVar9 & 0x3f800000);
LAB_0018e5d7:
          (optr->ex_cont).v_flt = tVar23;
          goto LAB_0018be23;
        }
        if (lStack_50 == 1) {
          if (lStack_70 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) goto LAB_0018ed72;
              optr->ex_type = 0xf;
              ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar12;
            }
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] =
                   (t_float)(-(uint)(local_78.v_vec[lVar16] <= (float)local_58.v_int) & 0x3f800000);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] =
                     (t_float)(-(uint)(local_78.v_flt <= (float)local_58.v_int) & 0x3f800000);
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            bVar22 = local_78.v_flt <= (float)local_58.v_int;
LAB_0018e592:
            fVar24 = (float)(-(uint)bVar22 & 0x3f800000);
            goto LAB_0018e8b7;
          }
          if (lStack_70 == 1) {
            if (optr->ex_type == 0xf) {
              if (local_58.v_int < local_78.v_int) {
                tVar23 = 0.0;
              }
              else {
                tVar23 = 1.0;
              }
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = tVar23;
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 1;
            aVar11.v_int._1_7_ = 0;
            aVar11.v_int._0_1_ = local_78.v_int <= local_58.v_int;
LAB_0018e64e:
            optr->ex_cont = aVar11;
            goto LAB_0018be23;
          }
          goto LAB_0018bd6d;
        }
        pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
      }
      uVar21 = 0x4cd;
      break;
    case 0xa000b:
      peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
      peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
      if (lStack_50 - 0xeU < 2) {
        if (optr->ex_type == 0xf) {
          ptVar12 = (optr->ex_cont).v_vec;
        }
        else {
          if (optr->ex_type == 0xe) {
LAB_0018ed80:
            uVar21 = 0x4cb;
            goto LAB_0018edee;
          }
          optr->ex_type = 0xf;
          ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
          (optr->ex_cont).v_vec = ptVar12;
        }
        if (lStack_70 - 0xeU < 2) {
          lVar16 = 0;
          iVar18 = expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            iVar18 = 0;
          }
          for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] =
                 (t_float)(-(uint)(local_78.v_vec[lVar16] < local_58.v_vec[lVar16]) & 0x3f800000);
          }
          goto LAB_0018be23;
        }
        if (lStack_70 == 2) {
          lVar16 = 0;
          iVar18 = expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            iVar18 = 0;
          }
          for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] =
                 (t_float)(-(uint)(local_78.v_flt < local_58.v_vec[lVar16]) & 0x3f800000);
          }
          goto LAB_0018be23;
        }
        if (lStack_70 == 1) {
          lVar16 = 0;
          iVar18 = expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            iVar18 = 0;
          }
          for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] =
                 (t_float)(-(uint)((float)local_78.v_int < local_58.v_vec[lVar16]) & 0x3f800000);
          }
          goto LAB_0018be23;
        }
LAB_0018bd83:
        pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
        peVar10 = (ex_ex *)0x0;
      }
      else {
        if (lStack_50 == 2) {
          if (lStack_70 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) goto LAB_0018ed80;
              optr->ex_type = 0xf;
              ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar12;
            }
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] =
                   (t_float)(-(uint)(local_78.v_vec[lVar16] < local_58.v_flt) & 0x3f800000);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = (t_float)(-(uint)(local_78.v_flt < local_58.v_flt) & 0x3f800000);
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            uVar15 = local_78.v_flt;
          }
          else {
            if (lStack_70 != 1) goto LAB_0018bd83;
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] =
                     (t_float)(-(uint)((float)local_78.v_int < local_58.v_flt) & 0x3f800000);
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            uVar15 = (float)local_78.v_int;
          }
          uVar9 = -(uint)((float)uVar15 < local_58.v_flt);
          goto LAB_0018e5cc;
        }
        if (lStack_50 == 1) {
          if (lStack_70 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) goto LAB_0018ed80;
              optr->ex_type = 0xf;
              ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar12;
            }
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] =
                   (t_float)(-(uint)(local_78.v_vec[lVar16] < (float)local_58.v_int) & 0x3f800000);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] =
                     (t_float)(-(uint)(local_78.v_flt < (float)local_58.v_int) & 0x3f800000);
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            bVar22 = local_78.v_flt < (float)local_58.v_int;
            goto LAB_0018e592;
          }
          if (lStack_70 == 1) {
            if (optr->ex_type == 0xf) {
              if (local_78.v_int < local_58.v_int) {
                tVar23 = 1.0;
              }
              else {
                tVar23 = 0.0;
              }
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = tVar23;
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 1;
            aVar11.v_int._1_7_ = 0;
            aVar11.v_int._0_1_ = local_78.v_int < local_58.v_int;
            goto LAB_0018e64e;
          }
          goto LAB_0018bd83;
        }
        pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
      }
      uVar21 = 0x4cb;
      break;
    case 0xa000c:
      peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
      peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
      if (lStack_50 - 0xeU < 2) {
        if (optr->ex_type == 0xf) {
          ptVar12 = (optr->ex_cont).v_vec;
        }
        else {
          if (optr->ex_type == 0xe) {
LAB_0018ed42:
            uVar21 = 0x4c9;
            goto LAB_0018edee;
          }
          optr->ex_type = 0xf;
          ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
          (optr->ex_cont).v_vec = ptVar12;
        }
        if (lStack_70 - 0xeU < 2) {
          lVar16 = 0;
          iVar18 = expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            iVar18 = 0;
          }
          for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] =
                 (t_float)(-(uint)(local_58.v_vec[lVar16] <= local_78.v_vec[lVar16]) & 0x3f800000);
          }
          goto LAB_0018be23;
        }
        if (lStack_70 == 2) {
          lVar16 = 0;
          iVar18 = expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            iVar18 = 0;
          }
          for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] =
                 (t_float)(-(uint)(local_58.v_vec[lVar16] <= local_78.v_flt) & 0x3f800000);
          }
          goto LAB_0018be23;
        }
        if (lStack_70 == 1) {
          lVar16 = 0;
          iVar18 = expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            iVar18 = 0;
          }
          for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] =
                 (t_float)(-(uint)(local_58.v_vec[lVar16] <= (float)local_78.v_int) & 0x3f800000);
          }
          goto LAB_0018be23;
        }
LAB_0018bd2b:
        pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
        peVar10 = (ex_ex *)0x0;
      }
      else {
        if (lStack_50 == 2) {
          if (lStack_70 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) goto LAB_0018ed42;
              optr->ex_type = 0xf;
              ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar12;
            }
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] =
                   (t_float)(-(uint)(local_58.v_flt <= local_78.v_vec[lVar16]) & 0x3f800000);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = (t_float)(-(uint)(local_58.v_flt <= local_78.v_flt) & 0x3f800000);
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            uVar15 = local_58.v_flt;
LAB_0018e441:
            uVar9 = -(uint)((float)uVar15 <= local_78.v_flt);
            goto LAB_0018e5cc;
          }
          if (lStack_70 == 1) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] =
                     (t_float)(-(uint)(local_58.v_flt <= (float)local_78.v_int) & 0x3f800000);
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            uVar9 = -(uint)(local_58.v_flt <= (float)local_78.v_int);
            goto LAB_0018e5cc;
          }
          goto LAB_0018bd2b;
        }
        if (lStack_50 == 1) {
          if (lStack_70 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) goto LAB_0018ed42;
              optr->ex_type = 0xf;
              ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar12;
            }
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] =
                   (t_float)(-(uint)((float)local_58.v_int <= local_78.v_vec[lVar16]) & 0x3f800000);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] =
                     (t_float)(-(uint)((float)local_58.v_int <= local_78.v_flt) & 0x3f800000);
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            uVar15 = (float)local_58.v_int;
            goto LAB_0018e441;
          }
          if (lStack_70 == 1) {
            if (optr->ex_type == 0xf) {
              if (local_78.v_int < local_58.v_int) {
                tVar23 = 0.0;
              }
              else {
                tVar23 = 1.0;
              }
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = tVar23;
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 1;
            aVar11.v_int._1_7_ = 0;
            aVar11.v_int._0_1_ = local_58.v_int <= local_78.v_int;
            goto LAB_0018e64e;
          }
          goto LAB_0018bd2b;
        }
        pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
      }
      uVar21 = 0x4c9;
      break;
    case 0xa000d:
      peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
      peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
      if (lStack_50 - 0xeU < 2) {
        if (optr->ex_type == 0xf) {
          ptVar12 = (optr->ex_cont).v_vec;
        }
        else {
          if (optr->ex_type == 0xe) {
LAB_0018ed64:
            uVar21 = 0x4c7;
            goto LAB_0018edee;
          }
          optr->ex_type = 0xf;
          ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
          (optr->ex_cont).v_vec = ptVar12;
        }
        if (lStack_70 - 0xeU < 2) {
          lVar16 = 0;
          iVar18 = expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            iVar18 = 0;
          }
          for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] =
                 (t_float)(-(uint)(local_58.v_vec[lVar16] < local_78.v_vec[lVar16]) & 0x3f800000);
          }
          goto LAB_0018be23;
        }
        if (lStack_70 == 2) {
          lVar16 = 0;
          iVar18 = expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            iVar18 = 0;
          }
          for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] =
                 (t_float)(-(uint)(local_58.v_vec[lVar16] < local_78.v_flt) & 0x3f800000);
          }
          goto LAB_0018be23;
        }
        if (lStack_70 == 1) {
          lVar16 = 0;
          iVar18 = expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            iVar18 = 0;
          }
          for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] =
                 (t_float)(-(uint)(local_58.v_vec[lVar16] < (float)local_78.v_int) & 0x3f800000);
          }
          goto LAB_0018be23;
        }
LAB_0018bd57:
        pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
        peVar10 = (ex_ex *)0x0;
      }
      else {
        if (lStack_50 == 2) {
          if (lStack_70 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) goto LAB_0018ed64;
              optr->ex_type = 0xf;
              ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar12;
            }
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] =
                   (t_float)(-(uint)(local_58.v_flt < local_78.v_vec[lVar16]) & 0x3f800000);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = (t_float)(-(uint)(local_58.v_flt < local_78.v_flt) & 0x3f800000);
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            uVar15 = local_58.v_flt;
LAB_0018e4fd:
            uVar9 = -(uint)((float)uVar15 < local_78.v_flt);
            goto LAB_0018e5cc;
          }
          if (lStack_70 == 1) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] =
                     (t_float)(-(uint)(local_58.v_flt < (float)local_78.v_int) & 0x3f800000);
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            uVar9 = -(uint)(local_58.v_flt < (float)local_78.v_int);
            goto LAB_0018e5cc;
          }
          goto LAB_0018bd57;
        }
        if (lStack_50 == 1) {
          if (lStack_70 - 0xeU < 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
            }
            else {
              if (optr->ex_type == 0xe) goto LAB_0018ed64;
              optr->ex_type = 0xf;
              ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
              (optr->ex_cont).v_vec = ptVar12;
            }
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] =
                   (t_float)(-(uint)((float)local_58.v_int < local_78.v_vec[lVar16]) & 0x3f800000);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] =
                     (t_float)(-(uint)((float)local_58.v_int < local_78.v_flt) & 0x3f800000);
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            uVar15 = (float)local_58.v_int;
            goto LAB_0018e4fd;
          }
          if (lStack_70 == 1) {
            if (optr->ex_type == 0xf) {
              if (local_58.v_int < local_78.v_int) {
                tVar23 = 1.0;
              }
              else {
                tVar23 = 0.0;
              }
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = tVar23;
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 1;
            aVar11.v_int._1_7_ = 0;
            aVar11.v_int._0_1_ = local_58.v_int < local_78.v_int;
            goto LAB_0018e64e;
          }
          goto LAB_0018bd57;
        }
        pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
      }
      uVar21 = 0x4c7;
      break;
    default:
      if (lVar16 == 0xe0017) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          lVar16 = 0;
          iVar18 = expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            iVar18 = 0;
          }
          for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] = (t_float)(-(uint)(local_58.v_vec[lVar16] == 0.0) & 0x3f800000);
          }
          goto LAB_0018be23;
        }
        if (lStack_50 == 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
            iVar18 = expr->exp_vsize;
            for (lVar16 = 0; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] = (t_float)(-(uint)(local_58.v_flt == 0.0) & 0x3f800000);
            }
            goto LAB_0018be23;
          }
          optr->ex_type = 2;
          uVar15 = 0.0;
          goto LAB_0018c2f2;
        }
        if (lStack_50 != 1) {
          pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
          peVar10 = (ex_ex *)0x0;
          uVar21 = 0x4bb;
          break;
        }
        if (optr->ex_type == 0xf) {
          if ((void *)local_58.v_int == (void *)0x0) {
            tVar23 = 1.0;
          }
          else {
            tVar23 = 0.0;
          }
          ptVar12 = (optr->ex_cont).v_vec;
          iVar18 = expr->exp_vsize;
          for (lVar16 = 0; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] = tVar23;
          }
          goto LAB_0018be23;
        }
        optr->ex_type = 1;
        uVar13 = (ulong)((void *)local_58.v_int == (void *)0x0);
        goto LAB_0018e86e;
      }
      if (lVar16 == 0x40003) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0018ed9c:
              uVar21 = 0x4e4;
              goto LAB_0018edee;
            }
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          if (lStack_70 - 0xeU < 2) {
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              tVar23 = 1.0;
              if (((int)local_58.v_vec[lVar16] == 0) && ((int)local_78.v_vec[lVar16] == 0)) {
                tVar23 = 0.0;
              }
              ptVar12[lVar16] = tVar23;
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              tVar23 = 1.0;
              if ((int)local_58.v_vec[lVar16] == 0 && (int)local_78.v_flt == 0) {
                tVar23 = 0.0;
              }
              ptVar12[lVar16] = tVar23;
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 1) {
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              tVar23 = 1.0;
              if ((int)local_58.v_vec[lVar16] == 0 && (int)(float)local_78.v_int == 0) {
                tVar23 = 0.0;
              }
              ptVar12[lVar16] = tVar23;
            }
            goto LAB_0018be23;
          }
LAB_0018bdac:
          pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar10 = (ex_ex *)0x0;
        }
        else {
          fVar24 = local_78.v_flt;
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ed9c;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              lVar16 = 0;
              iVar18 = expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                iVar18 = 0;
              }
              for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
                tVar23 = 1.0;
                if (((int)local_58.v_flt == 0) && ((int)local_78.v_vec[lVar16] == 0)) {
                  tVar23 = 0.0;
                }
                ptVar12[lVar16] = tVar23;
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                auVar7._4_4_ = -(uint)((int)fVar24 == 0);
                auVar7._0_4_ = -(uint)((int)fVar24 == 0);
                auVar7._8_4_ = -(uint)((int)local_58.v_flt == 0);
                auVar7._12_4_ = -(uint)((int)local_58.v_flt == 0);
                iVar18 = movmskpd((int)(lStack_70 - 0xeU),auVar7);
                if (iVar18 == 3) {
                  tVar23 = 0.0;
                }
                else {
                  tVar23 = 1.0;
                }
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = tVar23;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = local_58.v_flt;
LAB_0018e6ae:
              auVar6._4_4_ = -(uint)((int)fVar24 == 0);
              auVar6._0_4_ = -(uint)((int)fVar24 == 0);
              auVar6._8_4_ = -(uint)((int)(float)uVar15 == 0);
              auVar6._12_4_ = -(uint)((int)(float)uVar15 == 0);
              iVar18 = movmskpd((int)lStack_70 + -0xe,auVar6);
              if (iVar18 != 3) goto LAB_0018e6c7;
            }
            else {
              if (lStack_70 != 1) goto LAB_0018bdac;
              if (optr->ex_type == 0xf) {
                if (fVar24 == 0.0 && (int)local_58.v_flt == 0) {
                  tVar23 = 0.0;
                }
                else {
                  tVar23 = 1.0;
                }
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = tVar23;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              if (fVar24 != 0.0 || (int)local_58.v_flt != 0) goto LAB_0018e6c7;
            }
LAB_0018e856:
            fVar24 = 0.0;
LAB_0018e8b7:
            (optr->ex_cont).v_flt = fVar24;
            goto LAB_0018be23;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ed9c;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              lVar16 = 0;
              iVar18 = expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                iVar18 = 0;
              }
              for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
                tVar23 = 1.0;
                if (((int)(float)local_58.v_int == 0) && ((int)local_78.v_vec[lVar16] == 0)) {
                  tVar23 = 0.0;
                }
                ptVar12[lVar16] = tVar23;
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                auVar5._4_4_ = -(uint)((int)fVar24 == 0);
                auVar5._0_4_ = -(uint)((int)fVar24 == 0);
                auVar5._8_4_ = -(uint)((int)(float)local_58.v_int == 0);
                auVar5._12_4_ = -(uint)((int)(float)local_58.v_int == 0);
                iVar18 = movmskpd((int)(lStack_70 - 0xeU),auVar5);
                if (iVar18 == 3) {
                  tVar23 = 0.0;
                }
                else {
                  tVar23 = 1.0;
                }
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = tVar23;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = (float)local_58.v_int;
              goto LAB_0018e6ae;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                if (fVar24 == 0.0 && local_58.v_flt == 0.0) {
                  tVar23 = 0.0;
                }
                else {
                  tVar23 = 1.0;
                }
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = tVar23;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 1;
              bVar22 = fVar24 == 0.0 && local_58.v_flt == 0.0;
LAB_0018e64b:
              aVar11.v_int._1_7_ = 0;
              aVar11.v_int._0_1_ = !bVar22;
              goto LAB_0018e64e;
            }
            goto LAB_0018bdac;
          }
          pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar21 = 0x4e4;
        break;
      }
      if (lVar16 == 0x50004) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0018ecdc:
              uVar21 = 0x4e2;
              goto LAB_0018edee;
            }
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          if (lStack_70 - 0xeU < 2) {
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              if (((int)local_58.v_vec[lVar16] == 0) ||
                 (tVar23 = 1.0, (int)local_78.v_vec[lVar16] == 0)) {
                tVar23 = 0.0;
              }
              ptVar12[lVar16] = tVar23;
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] =
                   (float)((int)local_58.v_vec[uVar20] != 0 && (int)local_78.v_flt != 0);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 1) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] =
                   (float)((int)local_58.v_vec[uVar20] != 0 && (int)(float)local_78.v_int != 0);
            }
            goto LAB_0018be23;
          }
LAB_0018bca7:
          pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar10 = (ex_ex *)0x0;
        }
        else {
          fVar24 = local_78.v_flt;
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ecdc;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              lVar16 = 0;
              iVar18 = expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                iVar18 = 0;
              }
              for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
                if (((int)local_58.v_flt == 0) || (tVar23 = 1.0, (int)local_78.v_vec[lVar16] == 0))
                {
                  tVar23 = 0.0;
                }
                ptVar12[lVar16] = tVar23;
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                auVar4._4_4_ = -(uint)((int)fVar24 == 0);
                auVar4._0_4_ = -(uint)((int)fVar24 == 0);
                auVar4._8_4_ = -(uint)((int)local_58.v_flt == 0);
                auVar4._12_4_ = -(uint)((int)local_58.v_flt == 0);
                iVar18 = movmskpd((int)(lStack_70 - 0xeU),auVar4);
                if (iVar18 == 0) {
                  tVar23 = 1.0;
                }
                else {
                  tVar23 = 0.0;
                }
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = tVar23;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = local_58.v_flt;
LAB_0018e209:
              auVar3._4_4_ = -(uint)((int)fVar24 == 0);
              auVar3._0_4_ = -(uint)((int)fVar24 == 0);
              auVar3._8_4_ = -(uint)((int)(float)uVar15 == 0);
              auVar3._12_4_ = -(uint)((int)(float)uVar15 == 0);
              iVar18 = movmskpd((int)lStack_70 + -0xe,auVar3);
              if (iVar18 != 0) goto LAB_0018e856;
LAB_0018e6c7:
              fVar24 = 1.0;
              goto LAB_0018e8b7;
            }
            if (lStack_70 != 1) goto LAB_0018bca7;
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = (float)(fVar24 != 0.0 && (int)local_58.v_flt != 0);
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            uVar9 = (uint)(fVar24 != 0.0 && (int)local_58.v_flt != 0);
LAB_0018e8b3:
            fVar24 = (float)(int)uVar9;
            goto LAB_0018e8b7;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ecdc;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              lVar16 = 0;
              iVar18 = expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                iVar18 = 0;
              }
              for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
                if (((int)(float)local_58.v_int == 0) ||
                   (tVar23 = 1.0, (int)local_78.v_vec[lVar16] == 0)) {
                  tVar23 = 0.0;
                }
                ptVar12[lVar16] = tVar23;
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                auVar2._4_4_ = -(uint)((int)fVar24 == 0);
                auVar2._0_4_ = -(uint)((int)fVar24 == 0);
                auVar2._8_4_ = -(uint)((int)(float)local_58.v_int == 0);
                auVar2._12_4_ = -(uint)((int)(float)local_58.v_int == 0);
                iVar18 = movmskpd((int)(lStack_70 - 0xeU),auVar2);
                if (iVar18 == 0) {
                  tVar23 = 1.0;
                }
                else {
                  tVar23 = 0.0;
                }
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = tVar23;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = (float)local_58.v_int;
              goto LAB_0018e209;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)(fVar24 != 0.0 && local_58.v_flt != 0.0);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 1;
              uVar13 = (ulong)(fVar24 != 0.0 && local_58.v_flt != 0.0);
              goto LAB_0018e86e;
            }
            goto LAB_0018bca7;
          }
          pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar21 = 0x4e2;
        break;
      }
      if (lVar16 == 0x60005) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0018ed53:
              uVar21 = 0x4e0;
              goto LAB_0018edee;
            }
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          if (lStack_70 - 0xeU < 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = (float)((int)local_78.v_vec[uVar20] | (int)local_58.v_vec[uVar20]);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = (float)((int)local_58.v_vec[uVar20] | (int)local_78.v_flt);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 1) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = (float)((int)local_58.v_vec[uVar20] | (int)(float)local_78.v_int);
            }
            goto LAB_0018be23;
          }
LAB_0018bd41:
          pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar10 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ed53;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = (float)((int)local_78.v_vec[uVar20] | (int)local_58.v_flt);
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)((int)local_78.v_flt | (int)local_58.v_flt);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = local_58.v_flt;
LAB_0018e499:
              uVar9 = (int)local_78.v_flt | (int)(float)uVar15;
LAB_0018e7db:
              fVar24 = (float)(int)uVar9;
              goto LAB_0018e8b7;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)(int)((int)local_58.v_flt | (uint)local_78.v_flt);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar9 = (int)local_58.v_flt | (uint)local_78.v_flt;
              goto LAB_0018e8b3;
            }
            goto LAB_0018bd41;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ed53;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = (float)((int)local_78.v_vec[uVar20] | (int)(float)local_58.v_int);
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)((int)local_78.v_flt | (int)(float)local_58.v_int);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = (float)local_58.v_int;
              goto LAB_0018e499;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)(int)((uint)local_78.v_flt | (uint)local_58.v_flt);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 1;
              uVar9 = (uint)local_78.v_flt | (uint)local_58.v_flt;
LAB_0018e86c:
              uVar13 = (ulong)(int)uVar9;
              goto LAB_0018e86e;
            }
            goto LAB_0018bd41;
          }
          pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar21 = 0x4e0;
      }
      else if (lVar16 == 0x70006) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0018eced:
              uVar21 = 0x4de;
              goto LAB_0018edee;
            }
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          if (lStack_70 - 0xeU < 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = (float)((int)local_78.v_vec[uVar20] ^ (int)local_58.v_vec[uVar20]);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = (float)((int)local_58.v_vec[uVar20] ^ (int)local_78.v_flt);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 1) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = (float)((int)local_58.v_vec[uVar20] ^ (int)(float)local_78.v_int);
            }
            goto LAB_0018be23;
          }
LAB_0018bcbd:
          pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar10 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018eced;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = (float)((int)local_78.v_vec[uVar20] ^ (int)local_58.v_flt);
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)((int)local_78.v_flt ^ (int)local_58.v_flt);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = local_58.v_flt;
LAB_0018e277:
              uVar9 = (int)local_78.v_flt ^ (int)(float)uVar15;
              goto LAB_0018e7db;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)(int)((int)local_58.v_flt ^ (uint)local_78.v_flt);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar9 = (int)local_58.v_flt ^ (uint)local_78.v_flt;
              goto LAB_0018e8b3;
            }
            goto LAB_0018bcbd;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018eced;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = (float)((int)local_78.v_vec[uVar20] ^ (int)(float)local_58.v_int);
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)((int)local_78.v_flt ^ (int)(float)local_58.v_int);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = (float)local_58.v_int;
              goto LAB_0018e277;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)(int)((uint)local_78.v_flt ^ (uint)local_58.v_flt);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 1;
              uVar9 = (uint)local_78.v_flt ^ (uint)local_58.v_flt;
              goto LAB_0018e86c;
            }
            goto LAB_0018bcbd;
          }
          pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar21 = 0x4de;
      }
      else if (lVar16 == 0x80007) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0018edb8:
              uVar21 = 0x4dc;
              goto LAB_0018edee;
            }
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          if (lStack_70 - 0xeU < 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = (float)((int)local_78.v_vec[uVar20] & (int)local_58.v_vec[uVar20]);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = (float)((int)local_58.v_vec[uVar20] & (int)local_78.v_flt);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 1) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = (float)((int)local_58.v_vec[uVar20] & (int)(float)local_78.v_int);
            }
            goto LAB_0018be23;
          }
LAB_0018bdd2:
          pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar10 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018edb8;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = (float)((int)local_78.v_vec[uVar20] & (int)local_58.v_flt);
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)((int)local_78.v_flt & (int)local_58.v_flt);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = local_58.v_flt;
LAB_0018e7d4:
              uVar9 = (int)local_78.v_flt & (int)(float)uVar15;
              goto LAB_0018e7db;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)(int)((int)local_58.v_flt & (uint)local_78.v_flt);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar9 = (int)local_58.v_flt & (uint)local_78.v_flt;
              goto LAB_0018e8b3;
            }
            goto LAB_0018bdd2;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018edb8;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = (float)((int)local_78.v_vec[uVar20] & (int)(float)local_58.v_int);
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)((int)local_78.v_flt & (int)(float)local_58.v_int);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = (float)local_58.v_int;
              goto LAB_0018e7d4;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)(int)((uint)local_78.v_flt & (uint)local_58.v_flt);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 1;
              uVar9 = (uint)local_78.v_flt & (uint)local_58.v_flt;
              goto LAB_0018e86c;
            }
            goto LAB_0018bdd2;
          }
          pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar21 = 0x4dc;
      }
      else if (lVar16 == 0x90008) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0018ed20:
              uVar21 = 0x4d1;
              goto LAB_0018edee;
            }
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          if (lStack_70 - 0xeU < 2) {
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] =
                   (t_float)(-(uint)(local_78.v_vec[lVar16] != local_58.v_vec[lVar16]) & 0x3f800000)
              ;
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] =
                   (t_float)(-(uint)(local_58.v_vec[lVar16] != local_78.v_flt) & 0x3f800000);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 1) {
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] =
                   (t_float)(-(uint)(local_58.v_vec[lVar16] != (float)local_78.v_int) & 0x3f800000);
            }
            goto LAB_0018be23;
          }
LAB_0018bcff:
          pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar10 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ed20;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              lVar16 = 0;
              iVar18 = expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                iVar18 = 0;
              }
              for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
                ptVar12[lVar16] =
                     (t_float)(-(uint)(local_78.v_vec[lVar16] != local_58.v_flt) & 0x3f800000);
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] =
                       (t_float)(-(uint)(local_78.v_flt != local_58.v_flt) & 0x3f800000);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = local_78.v_flt;
            }
            else {
              if (lStack_70 != 1) goto LAB_0018bcff;
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] =
                       (t_float)(-(uint)((float)local_78.v_int != local_58.v_flt) & 0x3f800000);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = (float)local_78.v_int;
            }
            uVar9 = -(uint)((float)uVar15 != local_58.v_flt);
            goto LAB_0018e5cc;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ed20;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              lVar16 = 0;
              iVar18 = expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                iVar18 = 0;
              }
              for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
                ptVar12[lVar16] =
                     (t_float)(-(uint)(local_78.v_vec[lVar16] != (float)local_58.v_int) & 0x3f800000
                              );
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] =
                       (t_float)(-(uint)((float)local_58.v_int != local_78.v_flt) & 0x3f800000);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar9 = -(uint)((float)local_58.v_int != local_78.v_flt);
              goto LAB_0018e5cc;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                if (local_58.v_int == local_78.v_int) {
                  tVar23 = 0.0;
                }
                else {
                  tVar23 = 1.0;
                }
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = tVar23;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 1;
              bVar22 = local_58.v_int == local_78.v_int;
              goto LAB_0018e64b;
            }
            goto LAB_0018bcff;
          }
          pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar21 = 0x4d1;
      }
      else if (lVar16 == 0x90009) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0018ecfe:
              uVar21 = 0x4cf;
              goto LAB_0018edee;
            }
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          if (lStack_70 - 0xeU < 2) {
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] =
                   (t_float)(-(uint)(local_78.v_vec[lVar16] == local_58.v_vec[lVar16]) & 0x3f800000)
              ;
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] =
                   (t_float)(-(uint)(local_58.v_vec[lVar16] == local_78.v_flt) & 0x3f800000);
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 1) {
            lVar16 = 0;
            iVar18 = expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              iVar18 = 0;
            }
            for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] =
                   (t_float)(-(uint)(local_58.v_vec[lVar16] == (float)local_78.v_int) & 0x3f800000);
            }
            goto LAB_0018be23;
          }
LAB_0018bcd3:
          pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar10 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ecfe;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              lVar16 = 0;
              iVar18 = expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                iVar18 = 0;
              }
              for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
                ptVar12[lVar16] =
                     (t_float)(-(uint)(local_78.v_vec[lVar16] == local_58.v_flt) & 0x3f800000);
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] =
                       (t_float)(-(uint)(local_78.v_flt == local_58.v_flt) & 0x3f800000);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = local_78.v_flt;
            }
            else {
              if (lStack_70 != 1) goto LAB_0018bcd3;
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] =
                       (t_float)(-(uint)((float)local_78.v_int == local_58.v_flt) & 0x3f800000);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = (float)local_78.v_int;
            }
LAB_0018c2f2:
            uVar9 = -(uint)((float)uVar15 == local_58.v_flt);
            goto LAB_0018e5cc;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ecfe;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              lVar16 = 0;
              iVar18 = expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                iVar18 = 0;
              }
              for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
                ptVar12[lVar16] =
                     (t_float)(-(uint)(local_78.v_vec[lVar16] == (float)local_58.v_int) & 0x3f800000
                              );
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] =
                       (t_float)(-(uint)((float)local_58.v_int == local_78.v_flt) & 0x3f800000);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar9 = -(uint)((float)local_58.v_int == local_78.v_flt);
              goto LAB_0018e5cc;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                if (local_58.v_int == local_78.v_int) {
                  tVar23 = 1.0;
                }
                else {
                  tVar23 = 0.0;
                }
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = tVar23;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 1;
              aVar11.v_int._1_7_ = 0;
              aVar11.v_int._0_1_ = local_58.v_int == local_78.v_int;
              goto LAB_0018e64e;
            }
            goto LAB_0018bcd3;
          }
          pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar21 = 0x4cf;
      }
      else if (lVar16 == 0xb000e) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0018edd4:
              uVar21 = 0x4da;
              goto LAB_0018edee;
            }
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          if (lStack_70 - 0xeU < 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] =
                   (float)((int)local_58.v_vec[uVar20] >> ((byte)(int)local_78.v_vec[uVar20] & 0x1f)
                          );
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] =
                   (float)((int)local_58.v_vec[uVar20] >> ((byte)(int)local_78.v_flt & 0x1f));
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 1) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] =
                   (float)((int)local_58.v_vec[uVar20] >> ((byte)(int)(float)local_78.v_int & 0x1f))
              ;
            }
            goto LAB_0018be23;
          }
LAB_0018bdf8:
          pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar10 = (ex_ex *)0x0;
        }
        else {
          uVar15 = local_78.v_flt;
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018edd4;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] =
                     (float)((int)local_58.v_flt >> ((byte)(int)local_78.v_vec[uVar20] & 0x1f));
              }
              goto LAB_0018be23;
            }
            fVar24 = local_58.v_flt;
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                bVar1 = (byte)(int)(float)uVar15 & 0x1f;
                uVar20 = (ulong)(uint)(0 >> bVar1);
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)((int)local_58.v_flt >> bVar1);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
LAB_0018e8ac:
              uVar14 = (byte)(int)(float)uVar15;
            }
            else {
              if (lStack_70 != 1) goto LAB_0018bdf8;
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = (ulong)(uint)(0 >> (local_78.v_int._0_1_ & 0x1f));
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)((int)local_58.v_flt >> (local_78.v_int._0_1_ & 0x1f));
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar14 = local_78.v_int._0_1_;
            }
            uVar9 = (int)fVar24 >> (uVar14 & 0x1f);
            goto LAB_0018e8b3;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018edd4;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] =
                     (float)((int)(float)local_58.v_int >>
                            ((byte)(int)local_78.v_vec[uVar20] & 0x1f));
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                bVar1 = (byte)(int)(float)uVar15 & 0x1f;
                uVar20 = (ulong)(uint)(0 >> bVar1);
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)((int)(float)local_58.v_int >> bVar1);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              fVar24 = (float)local_58.v_int;
              goto LAB_0018e8ac;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = (ulong)(uint)(0 >> (local_78.v_int._0_1_ & 0x1f));
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)((int)local_58.v_flt >> (local_78.v_int._0_1_ & 0x1f));
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 1;
              uVar9 = (int)local_58.v_flt >> (local_78.v_int._0_1_ & 0x1f);
              goto LAB_0018e86c;
            }
            goto LAB_0018bdf8;
          }
          pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar21 = 0x4da;
      }
      else if (lVar16 == 0xb000f) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0018ed31:
              uVar21 = 0x4d8;
              goto LAB_0018edee;
            }
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          if (lStack_70 - 0xeU < 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] =
                   (float)((int)local_58.v_vec[uVar20] << ((byte)(int)local_78.v_vec[uVar20] & 0x1f)
                          );
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] =
                   (float)((int)local_58.v_vec[uVar20] << ((byte)(int)local_78.v_flt & 0x1f));
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 1) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] =
                   (float)((int)local_58.v_vec[uVar20] << ((byte)(int)(float)local_78.v_int & 0x1f))
              ;
            }
            goto LAB_0018be23;
          }
LAB_0018bd15:
          pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar10 = (ex_ex *)0x0;
        }
        else {
          uVar15 = local_78.v_flt;
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ed31;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] =
                     (float)((int)local_58.v_flt << ((byte)(int)local_78.v_vec[uVar20] & 0x1f));
              }
              goto LAB_0018be23;
            }
            fVar24 = local_58.v_flt;
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                bVar1 = (byte)(int)(float)uVar15 & 0x1f;
                uVar20 = (ulong)(uint)(0 << bVar1);
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)((int)local_58.v_flt << bVar1);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
LAB_0018e3dd:
              uVar14 = (byte)(int)(float)uVar15;
            }
            else {
              if (lStack_70 != 1) goto LAB_0018bd15;
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = (ulong)(uint)(0 << (local_78.v_int._0_1_ & 0x1f));
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)((int)local_58.v_flt << (local_78.v_int._0_1_ & 0x1f));
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar14 = local_78.v_int._0_1_;
            }
            uVar9 = (int)fVar24 << (uVar14 & 0x1f);
            goto LAB_0018e8b3;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ed31;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] =
                     (float)((int)(float)local_58.v_int <<
                            ((byte)(int)local_78.v_vec[uVar20] & 0x1f));
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                bVar1 = (byte)(int)(float)uVar15 & 0x1f;
                uVar20 = (ulong)(uint)(0 << bVar1);
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)((int)(float)local_58.v_int << bVar1);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              fVar24 = (float)local_58.v_int;
              goto LAB_0018e3dd;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = (ulong)(uint)(0 << (local_78.v_int._0_1_ & 0x1f));
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)((int)local_58.v_flt << (local_78.v_int._0_1_ & 0x1f));
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 1;
              uVar9 = (int)local_58.v_flt << (local_78.v_int._0_1_ & 0x1f);
              goto LAB_0018e86c;
            }
            goto LAB_0018bd15;
          }
          pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar21 = 0x4d8;
      }
      else if (lVar16 == 0xc0010) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0018ede2:
              uVar21 = 0x4c5;
              goto LAB_0018edee;
            }
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          if (lStack_70 - 0xeU < 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = local_58.v_vec[uVar20] - local_78.v_vec[uVar20];
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = local_58.v_vec[uVar20] - local_78.v_flt;
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 1) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = local_58.v_vec[uVar20] - (float)local_78.v_int;
            }
            goto LAB_0018be23;
          }
LAB_0018be0b:
          pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar10 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ede2;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = local_58.v_flt - local_78.v_vec[uVar20];
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = local_58.v_flt - local_78.v_flt;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = local_58.v_flt;
LAB_0018e910:
              fVar24 = (float)uVar15 - local_78.v_flt;
              goto LAB_0018e8b7;
            }
            if (lStack_70 != 1) goto LAB_0018be0b;
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = local_58.v_flt - (float)local_78.v_int;
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            tVar23 = local_58.v_flt - (float)local_78.v_int;
            goto LAB_0018e5d7;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ede2;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = (float)local_58.v_int - local_78.v_vec[uVar20];
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)local_58.v_int - local_78.v_flt;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = (float)local_58.v_int;
              goto LAB_0018e910;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)(local_58.v_int - local_78.v_int);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 1;
              uVar13 = (long)local_58.v_vec - (long)local_78;
              goto LAB_0018e86e;
            }
            goto LAB_0018be0b;
          }
          pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar21 = 0x4c5;
      }
      else if (lVar16 == 0xc0011) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0018ed8e:
              uVar21 = 0x4c3;
              goto LAB_0018edee;
            }
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          if (lStack_70 - 0xeU < 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = local_58.v_vec[uVar20] + local_78.v_vec[uVar20];
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = local_58.v_vec[uVar20] + local_78.v_flt;
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 1) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = local_58.v_vec[uVar20] + (float)local_78.v_int;
            }
            goto LAB_0018be23;
          }
LAB_0018bd99:
          pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar10 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ed8e;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = local_78.v_vec[uVar20] + local_58.v_flt;
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = local_58.v_flt + local_78.v_flt;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = local_58.v_flt;
LAB_0018e62f:
              fVar24 = (float)uVar15 + local_78.v_flt;
              goto LAB_0018e8b7;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)local_78.v_int + local_58.v_flt;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              fVar24 = (float)local_78.v_int + local_58.v_flt;
              goto LAB_0018e8b7;
            }
            goto LAB_0018bd99;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ed8e;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = local_78.v_vec[uVar20] + (float)local_58.v_int;
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)local_58.v_int + local_78.v_flt;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = (float)local_58.v_int;
              goto LAB_0018e62f;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)(local_78.v_int + local_58.v_int);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 1;
              uVar13 = (long)local_78.v_vec + (long)local_58.v_vec;
              goto LAB_0018e86e;
            }
            goto LAB_0018bd99;
          }
          pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar21 = 0x4c3;
      }
      else if (lVar16 == 0xd0012) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
        if (1 < lStack_50 - 0xeU) {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018edc6;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              aVar11 = local_78;
              iVar18 = (int)local_58.v_flt;
              for (lVar16 = 0; (int)lVar16 < expr->exp_vsize; lVar16 = lVar16 + 1) {
                if ((int)aVar11.v_vec[lVar16] == 0) {
                  ex_dzdetect(expr);
                  tVar23 = 0.0;
                }
                else {
                  tVar23 = (t_float)(iVar18 % (int)aVar11.v_vec[lVar16]);
                }
                ptVar12[lVar16] = tVar23;
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                if ((int)local_78.v_flt == 0) {
                  ex_dzdetect(expr);
                  tVar23 = 0.0;
                }
                else {
                  tVar23 = (t_float)((int)local_58.v_flt % (int)local_78.v_flt);
                }
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = tVar23;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = (undefined4)local_78.v_flt;
            }
            else {
              if (lStack_70 != 1) goto LAB_0018bde5;
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                if (local_78.v_flt == 0.0) {
                  ex_dzdetect(expr);
                  tVar23 = 0.0;
                }
                else {
                  tVar23 = (t_float)((int)local_58.v_flt % (int)local_78.v_int._0_4_);
                }
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = tVar23;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = local_78.v_flt;
            }
            uVar8 = local_58.v_flt;
            if ((float)uVar15 != 0.0) {
LAB_0018e845:
              fVar24 = (float)((int)(float)uVar8 % (int)uVar15);
              goto LAB_0018e8b7;
            }
          }
          else {
            if (lStack_50 != 1) {
              pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
              goto LAB_0018bdee;
            }
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018edc6;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              aVar11 = local_78;
              fVar24 = (float)local_58.v_int;
              for (lVar16 = 0; (int)lVar16 < expr->exp_vsize; lVar16 = lVar16 + 1) {
                if ((int)aVar11.v_vec[lVar16] == 0) {
                  ex_dzdetect(expr);
                  tVar23 = 0.0;
                }
                else {
                  tVar23 = (t_float)((int)fVar24 % (int)aVar11.v_vec[lVar16]);
                }
                ptVar12[lVar16] = tVar23;
              }
              goto LAB_0018be23;
            }
            if (lStack_70 != 2) {
              if (lStack_70 == 1) {
                if (optr->ex_type == 0xf) {
                  ptVar12 = (optr->ex_cont).v_vec;
                  if (local_78.v_flt == 0.0) {
                    ex_dzdetect(expr);
                    tVar23 = 0.0;
                  }
                  else {
                    tVar23 = (t_float)((int)local_58.v_int._0_4_ % (int)local_78.v_int._0_4_);
                  }
                  uVar20 = 0;
                  uVar13 = (ulong)(uint)expr->exp_vsize;
                  if (expr->exp_vsize < 1) {
                    uVar13 = uVar20;
                  }
                  for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                    ptVar12[uVar20] = tVar23;
                  }
                  goto LAB_0018be23;
                }
                optr->ex_type = 1;
                if (local_78.v_flt == 0.0) {
LAB_0018e927:
                  ex_dzdetect(expr);
                  uVar13 = 0;
                }
                else {
                  uVar13 = (ulong)((int)local_58.v_int._0_4_ % (int)local_78.v_int._0_4_);
                }
                goto LAB_0018e86e;
              }
              goto LAB_0018bde5;
            }
            if (optr->ex_type == 0xf) {
              ptVar12 = (optr->ex_cont).v_vec;
              if ((int)local_78.v_flt == 0) {
                ex_dzdetect(expr);
                tVar23 = 0.0;
              }
              else {
                tVar23 = (t_float)((int)(float)local_58.v_int % (int)local_78.v_flt);
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = tVar23;
              }
              goto LAB_0018be23;
            }
            optr->ex_type = 2;
            uVar15 = (undefined4)local_78.v_flt;
            if ((float)uVar15 != 0.0) {
              uVar8 = (float)local_58.v_int;
              goto LAB_0018e845;
            }
          }
LAB_0018e84e:
          ex_dzdetect(expr);
          goto LAB_0018e856;
        }
        if (optr->ex_type == 0xf) {
          ptVar12 = (optr->ex_cont).v_vec;
        }
        else {
          if (optr->ex_type == 0xe) {
LAB_0018edc6:
            uVar21 = 0x4ec;
            goto LAB_0018edee;
          }
          optr->ex_type = 0xf;
          ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
          (optr->ex_cont).v_vec = ptVar12;
        }
        aVar25 = local_58;
        aVar11 = local_78;
        if (lStack_70 - 0xeU < 2) {
          for (lVar16 = 0; (int)lVar16 < expr->exp_vsize; lVar16 = lVar16 + 1) {
            if ((int)aVar11.v_vec[lVar16] == 0) {
              ex_dzdetect(expr);
              tVar23 = 0.0;
            }
            else {
              tVar23 = (t_float)((int)aVar25.v_vec[lVar16] % (int)aVar11.v_vec[lVar16]);
            }
            ptVar12[lVar16] = tVar23;
          }
          goto LAB_0018be23;
        }
        if (lStack_70 == 2) {
          iVar18 = (int)local_78.v_flt;
          for (lVar16 = 0; (int)lVar16 < expr->exp_vsize; lVar16 = lVar16 + 1) {
            if (iVar18 == 0) {
              ex_dzdetect(expr);
              tVar23 = 0.0;
            }
            else {
              tVar23 = (t_float)((int)aVar25.v_vec[lVar16] % iVar18);
            }
            ptVar12[lVar16] = tVar23;
          }
          goto LAB_0018be23;
        }
        if (lStack_70 == 1) {
          fVar24 = (float)local_78.v_int;
          for (lVar16 = 0; (int)lVar16 < expr->exp_vsize; lVar16 = lVar16 + 1) {
            if ((int)fVar24 == 0) {
              ex_dzdetect(expr);
              tVar23 = 0.0;
            }
            else {
              tVar23 = (t_float)((int)aVar25.v_vec[lVar16] % (int)fVar24);
            }
            ptVar12[lVar16] = tVar23;
          }
          goto LAB_0018be23;
        }
LAB_0018bde5:
        pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
        peVar10 = (ex_ex *)0x0;
LAB_0018bdee:
        uVar21 = 0x4ec;
      }
      else if (lVar16 == 0xd0013) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0018edaa:
              uVar21 = 0x4f3;
              goto LAB_0018edee;
            }
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          aVar25 = local_58;
          aVar11 = local_78;
          if (lStack_70 - 0xeU < 2) {
            for (lVar16 = 0; (int)lVar16 < expr->exp_vsize; lVar16 = lVar16 + 1) {
              fVar24 = aVar11.v_vec[lVar16];
              if ((fVar24 != 0.0) || (NAN(fVar24))) {
                tVar23 = aVar25.v_vec[lVar16] / fVar24;
              }
              else {
                ex_dzdetect(expr);
                tVar23 = 0.0;
              }
              ptVar12[lVar16] = tVar23;
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            local_34 = local_78.v_flt;
            uVar15 = local_78.v_flt;
            for (lVar16 = 0; (int)lVar16 < expr->exp_vsize; lVar16 = lVar16 + 1) {
              if (((float)uVar15 != 0.0) || (NAN((float)uVar15))) {
                tVar23 = aVar25.v_vec[lVar16] / (float)uVar15;
              }
              else {
                ex_dzdetect(expr);
                tVar23 = 0.0;
                uVar15 = local_34;
              }
              ptVar12[lVar16] = tVar23;
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 1) {
            local_34 = (t_float)local_78.v_int;
            for (lVar16 = 0; (int)lVar16 < expr->exp_vsize; lVar16 = lVar16 + 1) {
              if ((void *)aVar11.v_int == (void *)0x0) {
                ex_dzdetect(expr);
                tVar23 = 0.0;
              }
              else {
                tVar23 = aVar25.v_vec[lVar16] / local_34;
              }
              ptVar12[lVar16] = tVar23;
            }
            goto LAB_0018be23;
          }
LAB_0018bdbf:
          pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar10 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018edaa;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              aVar11 = local_78;
              local_34 = local_58.v_flt;
              for (lVar16 = 0; (int)lVar16 < expr->exp_vsize; lVar16 = lVar16 + 1) {
                fVar24 = aVar11.v_vec[lVar16];
                if ((fVar24 != 0.0) || (NAN(fVar24))) {
                  tVar23 = local_34 / fVar24;
                }
                else {
                  ex_dzdetect(expr);
                  tVar23 = 0.0;
                }
                ptVar12[lVar16] = tVar23;
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                local_34 = 0.0;
                if ((local_78.v_flt != 0.0) || (NAN(local_78.v_flt))) {
                  local_34 = local_58.v_flt / local_78.v_flt;
                }
                else {
                  ex_dzdetect(expr);
                }
                lVar16 = 0;
                iVar18 = expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  iVar18 = 0;
                }
                for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
                  ptVar12[lVar16] = local_34;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = local_58.v_flt;
              if ((local_78.v_flt != 0.0) || (NAN(local_78.v_flt))) goto LAB_0018e778;
LAB_0018e917:
              local_34 = 0.0;
              ex_dzdetect(expr);
              fVar24 = local_34;
            }
            else {
              if (lStack_70 != 1) goto LAB_0018bdbf;
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                if ((void *)local_78.v_int == (void *)0x0) {
                  ex_dzdetect(expr);
                  tVar23 = 0.0;
                }
                else {
                  tVar23 = local_58.v_flt / (float)local_78.v_int;
                }
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = tVar23;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              if ((void *)local_78.v_int == (void *)0x0) goto LAB_0018e84e;
              fVar24 = local_58.v_flt / (float)local_78.v_int;
            }
            goto LAB_0018e8b7;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018edaa;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              aVar11 = local_78;
              local_34 = (t_float)local_58.v_int;
              for (lVar16 = 0; (int)lVar16 < expr->exp_vsize; lVar16 = lVar16 + 1) {
                fVar24 = aVar11.v_vec[lVar16];
                if ((fVar24 != 0.0) || (NAN(fVar24))) {
                  tVar23 = local_34 / fVar24;
                }
                else {
                  ex_dzdetect(expr);
                  tVar23 = 0.0;
                }
                ptVar12[lVar16] = tVar23;
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                local_34 = 0.0;
                if ((local_78.v_flt != 0.0) || (NAN(local_78.v_flt))) {
                  local_34 = (float)local_58.v_int / local_78.v_flt;
                }
                else {
                  ex_dzdetect(expr);
                }
                lVar16 = 0;
                iVar18 = expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  iVar18 = 0;
                }
                for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
                  ptVar12[lVar16] = local_34;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              if ((local_78.v_flt == 0.0) && (!NAN(local_78.v_flt))) goto LAB_0018e917;
              uVar15 = (float)local_58.v_int;
LAB_0018e778:
              local_34 = (float)uVar15 / local_78.v_flt;
              fVar24 = local_34;
              goto LAB_0018e8b7;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                if ((void *)local_78.v_int == (void *)0x0) {
                  ex_dzdetect(expr);
                  tVar23 = 0.0;
                }
                else {
                  tVar23 = (t_float)(local_58.v_int / local_78.v_int);
                }
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = tVar23;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 1;
              if ((void *)local_78.v_int == (void *)0x0) goto LAB_0018e927;
              uVar13 = local_58.v_int / local_78.v_int;
              goto LAB_0018e86e;
            }
            goto LAB_0018bdbf;
          }
          pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar21 = 0x4f3;
      }
      else if (lVar16 == 0xd0014) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_78,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            if (optr->ex_type == 0xe) {
LAB_0018ed0f:
              uVar21 = 0x4c1;
              goto LAB_0018edee;
            }
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          if (lStack_70 - 0xeU < 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = local_58.v_vec[uVar20] * local_78.v_vec[uVar20];
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 2) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = local_58.v_vec[uVar20] * local_78.v_flt;
            }
            goto LAB_0018be23;
          }
          if (lStack_70 == 1) {
            uVar20 = 0;
            uVar13 = (ulong)(uint)expr->exp_vsize;
            if (expr->exp_vsize < 1) {
              uVar13 = uVar20;
            }
            for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
              ptVar12[uVar20] = local_58.v_vec[uVar20] * (float)local_78.v_int;
            }
            goto LAB_0018be23;
          }
LAB_0018bce9:
          pcVar19 = "expr: ex_eval(%d): bad right type %ld\n";
          peVar10 = (ex_ex *)0x0;
        }
        else {
          if (lStack_50 == 2) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ed0f;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = local_78.v_vec[uVar20] * local_58.v_flt;
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = local_58.v_flt * local_78.v_flt;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = local_58.v_flt;
LAB_0018e32c:
              fVar24 = (float)uVar15 * local_78.v_flt;
              goto LAB_0018e8b7;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)local_78.v_int * local_58.v_flt;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              fVar24 = (float)local_78.v_int * local_58.v_flt;
              goto LAB_0018e8b7;
            }
            goto LAB_0018bce9;
          }
          if (lStack_50 == 1) {
            if (lStack_70 - 0xeU < 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
              }
              else {
                if (optr->ex_type == 0xe) goto LAB_0018ed0f;
                optr->ex_type = 0xf;
                ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
                (optr->ex_cont).v_vec = ptVar12;
              }
              uVar20 = 0;
              uVar13 = (ulong)(uint)expr->exp_vsize;
              if (expr->exp_vsize < 1) {
                uVar13 = uVar20;
              }
              for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                ptVar12[uVar20] = local_78.v_vec[uVar20] * (float)local_58.v_int;
              }
              goto LAB_0018be23;
            }
            if (lStack_70 == 2) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)local_58.v_int * local_78.v_flt;
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 2;
              uVar15 = (float)local_58.v_int;
              goto LAB_0018e32c;
            }
            if (lStack_70 == 1) {
              if (optr->ex_type == 0xf) {
                ptVar12 = (optr->ex_cont).v_vec;
                uVar20 = 0;
                uVar13 = (ulong)(uint)expr->exp_vsize;
                if (expr->exp_vsize < 1) {
                  uVar13 = uVar20;
                }
                for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
                  ptVar12[uVar20] = (float)(local_78.v_int * local_58.v_int);
                }
                goto LAB_0018be23;
              }
              optr->ex_type = 1;
              uVar13 = local_78.v_int * local_58.v_int;
              goto LAB_0018e86e;
            }
            goto LAB_0018bce9;
          }
          pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        }
        uVar21 = 0x4c1;
      }
      else if (lVar16 == 0xe0015) {
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          lVar16 = 0;
          iVar18 = expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            iVar18 = 0;
          }
          for (; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
            ptVar12[lVar16] = -local_58.v_vec[lVar16];
          }
          goto LAB_0018be23;
        }
        if (lStack_50 == 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
            iVar18 = expr->exp_vsize;
            for (lVar16 = 0; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] = -local_58.v_flt;
            }
            goto LAB_0018be23;
          }
          optr->ex_type = 2;
          fVar24 = -local_58.v_flt;
          goto LAB_0018e8b7;
        }
        if (lStack_50 == 1) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
            iVar18 = expr->exp_vsize;
            for (lVar16 = 0; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] = (float)-local_58.v_int;
            }
            goto LAB_0018be23;
          }
          optr->ex_type = 1;
          uVar13 = -local_58.v_int;
LAB_0018e86e:
          (optr->ex_cont).v_int = uVar13;
          goto LAB_0018be23;
        }
        pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        peVar10 = (ex_ex *)0x0;
        uVar21 = 0x4bf;
      }
      else {
        if (lVar16 != 0xe0016) {
          if (lVar16 == 0x3001c) {
            peVar10 = eval_store(expr,peVar10,optr,idx);
            return peVar10;
          }
          uVar13 = (ulong)(uint)(peVar10->ex_cont).v_flt;
          pcVar19 = "expr: ex_print: bad op 0x%x\n";
          goto LAB_00189689;
        }
        peVar10 = ex_eval(expr,peVar10,(ex_ex *)&local_58,idx);
        if (lStack_50 - 0xeU < 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
          }
          else {
            optr->ex_type = 0xf;
            ptVar12 = (t_float *)malloc((long)expr->exp_vsize << 2);
            (optr->ex_cont).v_vec = ptVar12;
          }
          uVar20 = 0;
          uVar13 = (ulong)(uint)expr->exp_vsize;
          if (expr->exp_vsize < 1) {
            uVar13 = uVar20;
          }
          for (; (int)uVar13 != (int)uVar20; uVar20 = uVar20 + 1) {
            ptVar12[uVar20] = (float)~(long)local_58.v_vec[uVar20];
          }
          goto LAB_0018be23;
        }
        if (lStack_50 == 2) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
            iVar18 = expr->exp_vsize;
            for (lVar16 = 0; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] = (float)~(long)local_58.v_flt;
            }
            goto LAB_0018be23;
          }
          optr->ex_type = 2;
          fVar24 = (float)~(long)local_58.v_flt;
          goto LAB_0018e8b7;
        }
        if (lStack_50 == 1) {
          if (optr->ex_type == 0xf) {
            ptVar12 = (optr->ex_cont).v_vec;
            iVar18 = expr->exp_vsize;
            for (lVar16 = 0; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
              ptVar12[lVar16] = (float)~local_58.v_int;
            }
            goto LAB_0018be23;
          }
          optr->ex_type = 1;
          uVar13 = ~local_58.v_int;
          goto LAB_0018e86e;
        }
        pcVar19 = "expr: ex_eval(%d): bad left type %ld\n";
        peVar10 = (ex_ex *)0x0;
        uVar21 = 0x4bd;
      }
    }
    pd_error(expr,pcVar19,uVar21);
LAB_0018be23:
    if (lStack_50 == 0xf) {
      free(local_58.v_vec);
    }
    if (lStack_70 != 0xf) {
      return peVar10;
    }
    free(local_78.v_vec);
    return peVar10;
  default:
    pcVar19 = "expr: ex_eval: unexpected type %d\n";
LAB_00189689:
    pd_error(expr,pcVar19,uVar13);
    return (ex_ex *)0x0;
  case 5:
  case 0xd:
    peVar10 = eval_tab(expr,eptr,optr,idx);
    return peVar10;
  case 6:
    peVar10 = eval_func(expr,eptr,optr,idx);
    return peVar10;
  case 7:
    if (optr->ex_type == 0xf) {
      pcVar19 = "expr: ex_eval: cannot turn string to vector\n";
      goto LAB_00189a0c;
    }
    break;
  case 8:
    if (optr->ex_type == 0xf) {
      pcVar19 = "expr: IntErr. vsym in for vec out\n";
      goto LAB_00189a0c;
    }
    if ((eptr->ex_cont).v_int == -1) goto LAB_001899a3;
    optr->ex_type = 7;
    aVar11 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont;
    goto LAB_001899fc;
  case 0xb:
    if ((eptr->ex_cont).v_int == -1) {
LAB_001899a3:
      pcVar19 = "expr: ex_eval: inlet number not set\n";
LAB_00189a0c:
      pd_error(expr,pcVar19);
      return (ex_ex *)0x0;
    }
    if (optr->ex_type == 0xf) {
      lVar16 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_int;
      ptVar12 = (optr->ex_cont).v_vec;
      iVar18 = expr->exp_vsize;
      for (lVar17 = 0; iVar18 != (int)lVar17; lVar17 = lVar17 + 1) {
        ptVar12[lVar17] = (float)lVar16;
      }
      goto LAB_001899ff;
    }
    optr->ex_type = 1;
    aVar11 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont;
LAB_001899fc:
    optr->ex_cont = aVar11;
    goto LAB_001899ff;
  case 0xc:
    if ((eptr->ex_cont).v_int == -1) goto LAB_001899a3;
    if (optr->ex_type == 0xf) {
      ptVar12 = (optr->ex_cont).v_vec;
      tVar23 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_flt;
      iVar18 = expr->exp_vsize;
      for (lVar16 = 0; iVar18 != (int)lVar16; lVar16 = lVar16 + 1) {
        ptVar12[lVar16] = tVar23;
      }
      goto LAB_001899ff;
    }
    optr->ex_type = 2;
    tVar23 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_flt;
    goto LAB_001899e5;
  case 0xe:
    if (optr->ex_type == 0xf) {
      ptVar12 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_vec;
      if ((optr->ex_cont).v_vec != ptVar12) {
        memcpy((optr->ex_cont).v_vec,ptVar12,(long)expr->exp_vsize << 2);
      }
      goto LAB_001899ff;
    }
    lVar16 = (eptr->ex_cont).v_int;
    optr->ex_end = expr->exp_var[lVar16].ex_end;
    aVar11 = expr->exp_var[lVar16].ex_cont;
    aVar25 = (&expr->exp_var[lVar16].ex_cont)[1];
    goto LAB_001899c5;
  case 0xf:
    if (optr->ex_type == 0xf) {
      ptVar12 = (optr->ex_cont).v_vec;
      if (ptVar12 == (eptr->ex_cont).v_vec) {
        post("expr int. error, optr->ex_vec = %d",ptVar12);
        abort();
      }
      memcpy(ptVar12,(eptr->ex_cont).v_vec,(long)expr->exp_vsize << 2);
      free((eptr->ex_cont).v_vec);
    }
    else {
      optr->ex_type = 0xf;
      optr->ex_cont = eptr->ex_cont;
      eptr->ex_type = 1;
      (eptr->ex_cont).v_int = 0;
    }
    goto LAB_001899ff;
  case 0x10:
  case 0x12:
    if (((expr->exp_flags & 3U) == 0) && (optr->ex_type != 0xf)) {
      peVar10 = eval_sigidx(expr,eptr,optr,idx);
      return peVar10;
    }
    pcVar19 = "%d:expr->exp_flags = %d";
    uVar21 = 0x495;
LAB_0018ecba:
    post(pcVar19,uVar21);
    abort();
  case 0x11:
    optr->ex_type = 2;
    lVar16 = 0x1f98;
    if (idx == 0) {
      idx = expr->exp_vsize;
      lVar16 = 0x1c78;
    }
    tVar23 = *(t_float *)
              (*(long *)((long)expr->exp_outlet + (eptr->ex_cont).v_int * 8 + lVar16 + -0x50) + -4 +
              (long)idx * 4);
    goto LAB_001899e5;
  case 0x14:
    if (((expr->exp_flags & 3U) != 0) || (optr->ex_type == 0xf)) {
      pcVar19 = "%d:exp->exp_flags = %d";
      uVar21 = 0x47d;
      goto LAB_0018ecba;
    }
    optr->ex_type = 2;
    tVar23 = expr->exp_var[(eptr->ex_cont).v_int].ex_cont.v_vec[idx];
LAB_001899e5:
    (optr->ex_cont).v_flt = tVar23;
    goto LAB_001899ff;
  case 0x15:
    peVar10 = eval_var(expr,eptr,optr,idx);
    return peVar10;
  }
  optr->ex_end = eptr->ex_end;
  aVar11 = eptr->ex_cont;
  aVar25 = (anon_union_8_5_735de1bb_for_ex_cont)eptr->ex_type;
LAB_001899c5:
  optr->ex_cont = aVar11;
  optr->ex_type = (long)aVar25;
LAB_001899ff:
  return eptr + 1;
}

Assistant:

struct ex_ex *
ex_eval(struct expr *expr, struct ex_ex *eptr, struct ex_ex *optr, int idx)
/* the expr object data pointer */
/* the operation stack */
/* the result pointer */
/* the sample number processed for fexpr~ */
{
        int i, j;
        t_float *lp, *rp, *op; /* left, right, and out pointer to vectors */
        t_float scalar;
        int nullret = 0;                /* did we have an error */
        struct ex_ex left = { 0 }, right = { 0 };       /* left and right operands */

        left.ex_type = 0;
        left.ex_int = 0;
        right.ex_type = 0;
        right.ex_int = 0;

        if (!eptr)
                return (exNULL);
        switch (eptr->ex_type) {
        case ET_INT:
                if (optr->ex_type == ET_VEC)
                        ex_mkvector(optr->ex_vec, (t_float) eptr->ex_int,
                                                                expr->exp_vsize);
                else
                        *optr = *eptr;
                return (++eptr);

        case ET_FLT:

                if (optr->ex_type == ET_VEC)
                        ex_mkvector(optr->ex_vec, eptr->ex_flt, expr->exp_vsize);
                else
                        *optr = *eptr;
                return (++eptr);

        case ET_SYM:
                if (optr->ex_type == ET_VEC) {
                        post_error((fts_object_t *) expr,
                              "expr: ex_eval: cannot turn string to vector\n");
                        return (exNULL);
                }
                *optr = *eptr;
                return (++eptr);
        case ET_II:
                if (eptr->ex_int == -1) {
                        post_error((fts_object_t *) expr,
                            "expr: ex_eval: inlet number not set\n");
                        return (exNULL);
                }
                if (optr->ex_type == ET_VEC) {
                        ex_mkvector(optr->ex_vec,
                               (t_float)expr->exp_var[eptr->ex_int].ex_int,
                                                                expr->exp_vsize);
                } else {
                        optr->ex_type = ET_INT;
                        optr->ex_int = expr->exp_var[eptr->ex_int].ex_int;
                }
                return (++eptr);
        case ET_FI:
                if (eptr->ex_int == -1) {
                        post_error((fts_object_t *) expr,
                            "expr: ex_eval: inlet number not set\n");
                        return (exNULL);
                }
                if (optr->ex_type == ET_VEC) {
                        ex_mkvector(optr->ex_vec,
                             expr->exp_var[eptr->ex_int].ex_flt, expr->exp_vsize);
                } else {
                        optr->ex_type = ET_FLT;
                        optr->ex_flt = expr->exp_var[eptr->ex_int].ex_flt;
                }
                return (++eptr);

        case ET_VSYM:
                if (optr->ex_type == ET_VEC) {
                        post_error((fts_object_t *) expr,
                            "expr: IntErr. vsym in for vec out\n");
                        return (exNULL);
                }
                if (eptr->ex_int == -1) {
                        post_error((fts_object_t *) expr,
                                "expr: ex_eval: inlet number not set\n");
                        return (exNULL);
                }
                optr->ex_type = ET_SYM;
                optr->ex_ptr = expr->exp_var[eptr->ex_int].ex_ptr;
                return(++eptr);

        case ET_VI:
                if (optr->ex_type != ET_VEC)
                        *optr = expr->exp_var[eptr->ex_int];
                else if (optr->ex_vec != expr->exp_var[eptr->ex_int].ex_vec)
                        memcpy(optr->ex_vec, expr->exp_var[eptr->ex_int].ex_vec,
                                        expr->exp_vsize * sizeof (t_float));
                return(++eptr);
        case ET_VEC:
                if (optr->ex_type != ET_VEC) {
                        optr->ex_type = ET_VEC;
                        optr->ex_vec = eptr->ex_vec;
                        eptr->ex_type = ET_INT;
                        eptr->ex_int = 0;
                } else if (optr->ex_vec != eptr->ex_vec) {
                        memcpy(optr->ex_vec, eptr->ex_vec,
                                        expr->exp_vsize * sizeof (t_float));
                        fts_free(eptr->ex_vec);
                } else { /* this should not happen */
                        post("expr int. error, optr->ex_vec = %d",optr->ex_vec);
                        abort();
                }
                return(++eptr);
        case ET_XI0:
                /* short hand for $x?[0] */

                /* SDY delete the following check */
                if (!IS_FEXPR_TILDE(expr) || optr->ex_type==ET_VEC) {
                        post("%d:exp->exp_flags = %d", __LINE__,expr->exp_flags);
                        abort();
                }
                optr->ex_type = ET_FLT;
                optr->ex_flt = expr->exp_var[eptr->ex_int].ex_vec[idx];
                return(++eptr);
        case ET_YOM1:
                /*
                 * short hand for $y?[-1]
                 * if we are calculating the first sample of the vector
                 * we need to look at the previous results buffer
                 */
                optr->ex_type = ET_FLT;
                if (idx == 0)
                        optr->ex_flt =
                        expr->exp_p_res[eptr->ex_int][expr->exp_vsize - 1];
                else
                        optr->ex_flt=expr->exp_tmpres[eptr->ex_int][idx-1];
                return(++eptr);

        case ET_YO:
        case ET_XI:
                /* SDY delete the following */
                if (!IS_FEXPR_TILDE(expr) || optr->ex_type==ET_VEC) {
                        post("%d:expr->exp_flags = %d", __LINE__,expr->exp_flags);
                        abort();
                }
                return (eval_sigidx(expr, eptr, optr, idx));

        case ET_TBL:
        case ET_SI:
                return (eval_tab(expr, eptr, optr, idx));
        case ET_FUNC:
                return (eval_func(expr, eptr, optr, idx));
        case ET_VAR:
                return (eval_var(expr, eptr, optr, idx));
        case ET_OP:
                break;
        case ET_STR:
        case ET_LP:
        case ET_LB:
        default:
                post_error((fts_object_t *) expr,
                        "expr: ex_eval: unexpected type %d\n",
                            (int)eptr->ex_type);
                return (exNULL);
        }
        if (!eptr[1].ex_type) {
                post_error((fts_object_t *) expr,
                                        "expr: ex_eval: not enough nodes 1\n");
                return (exNULL);
        }
        if (!unary_op(eptr->ex_op) && !eptr[2].ex_type) {
                post_error((fts_object_t *) expr,
                                        "expr: ex_eval: not enough nodes 2\n");
                return (exNULL);
        }

        switch((eptr++)->ex_op) {
        case OP_STORE:
                return (eval_store(expr, eptr, optr, idx));
        case OP_NOT:
                EVAL_UNARY(!, +);
        case OP_NEG:
                EVAL_UNARY(~, (long));
        case OP_UMINUS:
                EVAL_UNARY(-, +);
        case OP_MUL:
                EVAL(*);
        case OP_ADD:
                EVAL(+);
        case OP_SUB:
                EVAL(-);
        case OP_LT:
                EVAL(<);
        case OP_LE:
                EVAL(<=);
        case OP_GT:
                EVAL(>);
        case OP_GE:
                EVAL(>=);
        case OP_EQ:
                EVAL(==);
        case OP_NE:
                EVAL(!=);
/*
 * following operators convert their argument to integer
 */
#undef DZC
#define DZC(ARG1,OPR,ARG2)      (((int)ARG1) OPR ((int)ARG2))
        case OP_SL:
                EVAL(<<);
        case OP_SR:
                EVAL(>>);
        case OP_AND:
                EVAL(&);
        case OP_XOR:
                EVAL(^);
        case OP_OR:
                EVAL(|);
        case OP_LAND:
                EVAL(&&);
        case OP_LOR:
                EVAL(||);
/*
 * for modulo we need to convert to integer and check for divide by zero
 */
#undef DZC
#define DZC(ARG1,OPR,ARG2)      ((((int)ARG2)?(((int)ARG1) OPR ((int)ARG2)) \
                                                        : (ex_dzdetect(expr),0)))
        case OP_MOD:
                EVAL(%);
/*
 * define the divide by zero check for divide
 */
#undef DZC
#define DZC(ARG1,OPR,ARG2)      (((ARG2)?(ARG1 OPR ARG2):(ex_dzdetect(expr),0)))
        case OP_DIV:
                EVAL(/);
        case OP_LP:
        case OP_RP:
        case OP_LB:
        case OP_RB:
        case OP_COMMA:
        case OP_SEMI:
        default:
                post_error((fts_object_t *) expr,
                    "expr: ex_print: bad op 0x%x\n", (unsigned)eptr->ex_op);
                return (exNULL);
        }


        /*
         * the left and right nodes could have been transformed to vectors
         * down the chain
         */
        if (left.ex_type == ET_VEC)
                fts_free(left.ex_vec);
        if (right.ex_type == ET_VEC)
                fts_free(right.ex_vec);
        if (nullret)
                return (exNULL);
        else
                return (eptr);
}